

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O3

void matchit::impl::IdUtil<mathiu::impl::PieceWise>::bindValue<mathiu::impl::PieceWise_const&>
               (_Variadic_union<mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*> *v,
               _Variadic_union<mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*> value)

{
  _Variadic_union<std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
  local_20;
  undefined1 local_8;
  
  local_8 = 3;
  local_20._M_rest._M_rest = value;
  if (*(variant<std::monostate,mathiu::impl::PieceWise,mathiu::impl::PieceWise*,mathiu::impl::PieceWise_const*>
        *)(v + 3) ==
      (variant<std::monostate,mathiu::impl::PieceWise,mathiu::impl::PieceWise*,mathiu::impl::PieceWise_const*>
       )0x3) {
    *v = value;
  }
  else {
    std::
    variant<std::monostate,mathiu::impl::PieceWise,mathiu::impl::PieceWise*,mathiu::impl::PieceWise_const*>
    ::emplace<3ul,mathiu::impl::PieceWise_const*>
              ((variant<std::monostate,mathiu::impl::PieceWise,mathiu::impl::PieceWise*,mathiu::impl::PieceWise_const*>
                *)&v->_M_first,(PieceWise **)&local_20);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
                       *)&local_20);
  return;
}

Assistant:

constexpr static auto bindValue(ValueVariant<Type> &v, Value &&value,
                                                    std::true_type /* StorePointer */)
            {
                v = ValueVariant<Type>{&value};
            }